

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_pack.cpp
# Opt level: O2

ScalarFunction * duckdb::GetStructPackFunction<true>(void)

{
  ScalarFunction *in_RDI;
  FunctionNullHandling null_handling;
  code *bind_lambda;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"struct_pack",(allocator *)&local_60);
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_78,STRUCT);
  bind_lambda = StructPackFunction;
  null_handling = 0xf6;
  LogicalType::LogicalType(&local_48,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_98,&local_78,
             (scalar_function_t *)&stack0xffffffffffffff48,StructPackBind<true>,
             (bind_scalar_function_extended_t)0x0,StructPackStats,(init_local_state_t)0x0,
             (LogicalType)ZEXT824(&local_48),CONSISTENT,null_handling,bind_lambda);
  LogicalType::~LogicalType(&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff48);
  LogicalType::~LogicalType(&local_78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  ::std::__cxx11::string::~string((string *)&local_30);
  LogicalType::LogicalType(&local_60,ANY);
  LogicalType::operator=(&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs,&local_60)
  ;
  LogicalType::~LogicalType(&local_60);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->serialize = VariableReturnBindData::Serialize;
  in_RDI->deserialize = VariableReturnBindData::Deserialize;
  return in_RDI;
}

Assistant:

ScalarFunction GetStructPackFunction() {
	ScalarFunction fun(IS_STRUCT_PACK ? "struct_pack" : "row", {}, LogicalTypeId::STRUCT, StructPackFunction,
	                   StructPackBind<IS_STRUCT_PACK>, nullptr, StructPackStats);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = VariableReturnBindData::Serialize;
	fun.deserialize = VariableReturnBindData::Deserialize;
	return fun;
}